

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Reset
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  ushort count;
  
  memset(&this->freeBits,0,0x100);
  this->freeCount = 0;
  this->markCount = 0;
  uVar1 = this->objectCount;
  this->lastFreeCount = uVar1;
  this->oldFreeCount = uVar1;
  this->freeObjectList = (FreeObject *)0x0;
  this->lastFreeObjectHead = (FreeObject *)0x0;
  memset((void *)((long)this - (ulong)uVar1),0,(ulong)uVar1);
  this->isInAllocator = false;
  memset(&this->debugFreeBits,0,0x100);
  this->isClearedFromAllocator = false;
  this->isIntegratedBlock = false;
  this->markBits = (SmallHeapBlockBitVector *)0x0;
  BVar4 = BVStatic<2048UL>::Count(&this->explicitFreeBits);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x21f,"(this->explicitFreeBits.Count() == 0)",
                       "this->explicitFreeBits.Count() == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::Reset()
{
    this->GetFreeBitVector()->ClearAll();

    this->freeCount = 0;
    this->markCount = 0;
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
    {
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        this->hasFinishedSweepObjects = false;
        this->wasAllocatedFromDuringSweep = false;
        this->objectsMarkedDuringSweep = 0;
        this->objectsAllocatedDuringConcurrentSweepCount = 0;
        this->lastObjectsAllocatedDuringConcurrentSweepCount = 0;
#endif
        this->isPendingConcurrentSweepPrep = false;
    }
#endif

#if ENABLE_PARTIAL_GC
    this->oldFreeCount = this->lastFreeCount = this->objectCount;
#else
    this->lastFreeCount = this->objectCount;
#endif
    this->freeObjectList = nullptr;
    this->lastFreeObjectHead = nullptr;
    this->ClearObjectInfoList();

    this->isInAllocator = false;

#if DBG || defined(RECYCLER_STATS)
    this->GetDebugFreeBitVector()->ClearAll();
#endif

#if DBG
    this->isClearedFromAllocator = false;
    this->isIntegratedBlock = false;
#endif

    // There is no page associated with this heap block,
    // and therefore we should have no mark bits either
    this->markBits = nullptr;

    Assert(this->explicitFreeBits.Count() == 0);
}